

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

bitmask<slang::ast::MethodFlags>
slang::ast::SubroutineSymbol::buildArguments
          (Scope *scope,Scope *parentScope,FunctionPortListSyntax *syntax,
          VariableLifetime defaultLifetime,
          SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  WildcardImportData *pWVar1;
  SyntaxNode *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Scope *parentScope_00;
  SourceLocation SVar2;
  SourceLocation loc;
  ImplicitTypeSyntax *pIVar3;
  ushort uVar4;
  ArgumentDirection AVar5;
  ParentList *pPVar6;
  bool bVar7;
  SourceRange SVar8;
  ArgumentDirection direction;
  FormalArgumentSymbol *arg;
  const_iterator __begin2;
  ArgumentDirection local_9c;
  Symbol *local_98;
  SourceLocation local_90;
  uint local_88;
  undefined1 local_84 [28];
  Token local_68;
  Scope *local_58;
  ParentList *local_50;
  ulong local_48;
  iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*> local_40;
  
  local_84._4_8_ = scope->compilation;
  pPVar6 = &syntax->ports;
  local_40.index = 0;
  local_48 = (syntax->ports).elements._M_extent._M_extent_value + 1 >> 1;
  uVar4 = 0;
  local_88 = 0;
  AVar5 = In;
  local_84._12_8_ = (Scope *)0x0;
  local_98 = (Symbol *)0x0;
  local_84._0_4_ = defaultLifetime;
  local_84._20_8_ = arguments;
  local_58 = parentScope;
  local_50 = pPVar6;
  local_40.list = pPVar6;
  for (; (local_40.list != pPVar6 || (local_40.index != local_48));
      local_40.index = local_40.index + 1) {
    parentScope_00 =
         (Scope *)slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::
                  iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>::dereference
                            (&local_40);
    if ((SyntaxNode *)parentScope_00->nameMap != (SyntaxNode *)0x0) {
      Scope::addMembers(scope,(SyntaxNode *)parentScope_00->nameMap);
    }
    if (*(int *)&parentScope_00->compilation == 0x82) {
      if ((Scope *)local_84._12_8_ == (Scope *)0x0) {
        inheritDefaultedArgList
                  ((SubroutineSymbol *)scope,local_58,parentScope_00,(SyntaxNode *)local_84._20_8_,
                   arguments);
        local_88 = local_88 | 0x1000;
        local_84._12_8_ = parentScope_00;
      }
      else {
        SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)parentScope_00);
        Scope::addDiag(scope,(DiagCode)0x830006,SVar8);
      }
      local_98 = (Symbol *)0x0;
      AVar5 = In;
    }
    else {
      pWVar1 = parentScope_00[1].importData;
      local_9c = AVar5;
      if (pWVar1 != (WildcardImportData *)0x0) {
        local_9c = SemanticFacts::getDirection((TokenKind)parentScope_00[1].deferredMemberIndex);
        if (local_9c == Ref) {
          if (local_84._0_4_ == Static) {
            SVar8 = parsing::Token::range((Token *)&parentScope_00[1].deferredMemberIndex);
            Scope::addDiag(scope,(DiagCode)0xbb0006,SVar8);
          }
          bVar7 = parentScope_00[1].lastMember != (Symbol *)0x0;
          uVar4 = bVar7 + 0x20;
          if (parentScope_00[2].thisSym == (Symbol *)0x0) {
            uVar4 = (ushort)bVar7;
          }
        }
        else {
          uVar4 = 0;
        }
      }
      this = *(SyntaxNode **)&parentScope_00[2].deferredMemberIndex;
      local_68 = (Token)parsing::Token::valueText((Token *)(this + 1));
      local_90 = parsing::Token::location((Token *)(this + 1));
      arguments = (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)local_84;
      SVar2 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::VariableLifetime&>
                        ((BumpAllocator *)local_84._4_8_,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_90,
                         &local_9c,(VariableLifetime *)arguments);
      ((bitmask<slang::ast::VariableFlags> *)((long)SVar2 + 0x154))->m_bits =
           ((bitmask<slang::ast::VariableFlags> *)((long)SVar2 + 0x154))->m_bits | uVar4;
      local_90 = SVar2;
      if (parentScope_00[2].lastMember == (Symbol *)0x0) {
        if ((pWVar1 == (WildcardImportData *)0x0) && (local_98 != (Symbol *)0x0)) {
          ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar2 + 0x50))->typeSyntax =
               (DataTypeSyntax *)local_98;
          *(byte *)((long)SVar2 + 0x7f) = *(byte *)((long)SVar2 + 0x7f) & 0x7f;
        }
        else {
          local_68 = slang::syntax::SyntaxNode::getFirstToken(this);
          loc = parsing::Token::location(&local_68);
          pIVar3 = Compilation::createEmptyTypeSyntax((Compilation *)local_84._4_8_,loc);
          ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar2 + 0x50))->typeSyntax =
               &pIVar3->super_DataTypeSyntax;
          *(byte *)((long)SVar2 + 0x7f) = *(byte *)((long)SVar2 + 0x7f) & 0x7f;
          local_98 = (Symbol *)0x0;
        }
      }
      else {
        ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar2 + 0x50))->typeSyntax =
             (DataTypeSyntax *)parentScope_00[2].lastMember;
        *(byte *)((long)SVar2 + 0x7f) = *(byte *)((long)SVar2 + 0x7f) & 0x7f;
        local_98 = parentScope_00[2].lastMember;
      }
      syntax_00._M_ptr = (pointer)parentScope_00[1].thisSym;
      syntax_00._M_extent._M_extent_value = (size_t)parentScope_00[1].nameMap;
      Symbol::setAttributes((Symbol *)local_90,scope,syntax_00);
      *(SyntaxNode **)((long)local_90 + 0x38) = this;
      if (this[3].previewNode != (SyntaxNode *)0x0) {
        DeclaredType::setDimensionSyntax
                  ((DeclaredType *)((long)local_90 + 0x40),
                   (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&this[1].previewNode);
      }
      if (*(long *)(this + 4) != 0) {
        *(ExpressionSyntax **)((long)local_90 + 0x168) =
             *(ExpressionSyntax **)(*(long *)(this + 4) + 0x28);
        *(Expression **)((long)local_90 + 0x170) = (Expression *)0x0;
      }
      Scope::addMember(scope,(Symbol *)local_90);
      SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
      emplace_back<slang::ast::FormalArgumentSymbol_const*const&>
                ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)local_84._20_8_,
                 (FormalArgumentSymbol **)&local_90);
      pPVar6 = local_50;
      AVar5 = local_9c;
    }
  }
  return (bitmask<slang::ast::MethodFlags>)(underlying_type)local_88;
}

Assistant:

bitmask<MethodFlags> SubroutineSymbol::buildArguments(
    Scope& scope, const Scope& parentScope, const FunctionPortListSyntax& syntax,
    VariableLifetime defaultLifetime, SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    const DataTypeSyntax* lastType = nullptr;
    const SyntaxNode* explicitDefault = nullptr;
    auto lastDirection = ArgumentDirection::In;
    bitmask<VariableFlags> lastFlags;
    bitmask<MethodFlags> resultFlags;

    for (auto portBase : syntax.ports) {
        if (portBase->previewNode)
            scope.addMembers(*portBase->previewNode);

        if (portBase->kind == SyntaxKind::DefaultFunctionPort) {
            lastDirection = ArgumentDirection::In;
            lastType = nullptr;

            if (explicitDefault) {
                // Ignore a duplicate default.
                scope.addDiag(diag::MultipleDefaultConstructorArg, portBase->sourceRange());
            }
            else {
                explicitDefault = portBase;
                inheritDefaultedArgList(scope, parentScope, *portBase, arguments);
                resultFlags |= MethodFlags::DefaultedSuperArg;
            }
            continue;
        }

        auto direction = lastDirection;
        auto flags = lastFlags;
        bool directionSpecified = false;
        auto& fps = portBase->as<FunctionPortSyntax>();
        if (fps.direction) {
            directionSpecified = true;
            direction = SemanticFacts::getDirection(fps.direction.kind);
            flags = {};

            if (direction == ArgumentDirection::Ref) {
                if (defaultLifetime == VariableLifetime::Static)
                    scope.addDiag(diag::RefArgAutomaticFunc, fps.direction.range());

                if (fps.constKeyword)
                    flags |= VariableFlags::Const;

                if (fps.staticKeyword)
                    flags |= VariableFlags::RefStatic;
            }
        }

        auto& decl = *fps.declarator;
        auto arg = comp.emplace<FormalArgumentSymbol>(decl.name.valueText(), decl.name.location(),
                                                      direction, defaultLifetime);
        arg->flags |= flags;

        // If we're given a type, use that. Otherwise, if we were given a
        // direction, default to logic. Otherwise, use the last type.
        if (fps.dataType) {
            arg->setDeclaredType(*fps.dataType);
            lastType = fps.dataType;
        }
        else if (directionSpecified || !lastType) {
            arg->setDeclaredType(comp.createEmptyTypeSyntax(decl.getFirstToken().location()));
            lastType = nullptr;
        }
        else {
            arg->setDeclaredType(*lastType);
        }

        arg->setAttributes(scope, fps.attributes);
        arg->setSyntax(decl);

        if (!decl.dimensions.empty())
            arg->getDeclaredType()->setDimensionSyntax(decl.dimensions);

        if (decl.initializer)
            arg->setDefaultValueSyntax(*decl.initializer->expr);

        scope.addMember(*arg);
        arguments.push_back(arg);

        lastDirection = direction;
        lastFlags = flags;
    }

    return resultFlags;
}